

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

State * __thiscall anon_unknown.dwarf_6ba7a4::Parser::State::operator=(State *this,State *param_1)

{
  __node_base_ptr *pp_Var1;
  __node_base_ptr *pp_Var2;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  size_t sVar16;
  size_t sVar17;
  
  uVar7 = *(undefined4 *)&param_1->words;
  uVar8 = *(undefined4 *)((long)&param_1->words + 4);
  sVar16 = param_1->num_words;
  uVar9 = *(undefined4 *)((long)&param_1->num_words + 4);
  uVar10 = *(undefined4 *)&param_1->diagnostic;
  uVar11 = *(undefined4 *)((long)&param_1->diagnostic + 4);
  sVar17 = param_1->word_index;
  uVar12 = *(undefined4 *)((long)&param_1->word_index + 4);
  uVar13 = *(undefined4 *)((long)&param_1->instruction_count + 1);
  uVar14 = *(undefined4 *)((long)&param_1->instruction_count + 5);
  uVar15 = *(undefined4 *)((long)&param_1->endian + 1);
  *(undefined4 *)((long)&this->word_index + 5) = *(undefined4 *)((long)&param_1->word_index + 5);
  *(undefined4 *)((long)&this->instruction_count + 1) = uVar13;
  *(undefined4 *)((long)&this->instruction_count + 5) = uVar14;
  *(undefined4 *)((long)&this->endian + 1) = uVar15;
  *(undefined4 *)&this->diagnostic = uVar10;
  *(undefined4 *)((long)&this->diagnostic + 4) = uVar11;
  *(int *)&this->word_index = (int)sVar17;
  *(undefined4 *)((long)&this->word_index + 4) = uVar12;
  *(undefined4 *)&this->words = uVar7;
  *(undefined4 *)((long)&this->words + 4) = uVar8;
  *(int *)&this->num_words = (int)sVar16;
  *(undefined4 *)((long)&this->num_words + 4) = uVar9;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->id_to_type_id)._M_h,&param_1->id_to_type_id);
  if (param_1 != this) {
    p_Var6 = (this->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt;
    while (p_Var6 != (_Hash_node_base *)0x0) {
      p_Var3 = p_Var6->_M_nxt;
      operator_delete(p_Var6,0x18);
      p_Var6 = p_Var3;
    }
    pp_Var4 = (this->type_id_to_number_type_info)._M_h._M_buckets;
    pp_Var1 = &(this->type_id_to_number_type_info)._M_h._M_single_bucket;
    if (pp_Var1 != pp_Var4) {
      operator_delete(pp_Var4,(this->type_id_to_number_type_info)._M_h._M_bucket_count << 3);
    }
    uVar7 = *(undefined4 *)&(param_1->type_id_to_number_type_info)._M_h._M_rehash_policy.field_0x4;
    sVar16 = (param_1->type_id_to_number_type_info)._M_h._M_rehash_policy._M_next_resize;
    (this->type_id_to_number_type_info)._M_h._M_rehash_policy._M_max_load_factor =
         (param_1->type_id_to_number_type_info)._M_h._M_rehash_policy._M_max_load_factor;
    *(undefined4 *)&(this->type_id_to_number_type_info)._M_h._M_rehash_policy.field_0x4 = uVar7;
    (this->type_id_to_number_type_info)._M_h._M_rehash_policy._M_next_resize = sVar16;
    pp_Var4 = (param_1->type_id_to_number_type_info)._M_h._M_buckets;
    pp_Var2 = &(param_1->type_id_to_number_type_info)._M_h._M_single_bucket;
    if (pp_Var2 == pp_Var4) {
      (this->type_id_to_number_type_info)._M_h._M_buckets = pp_Var1;
      (this->type_id_to_number_type_info)._M_h._M_single_bucket = *pp_Var2;
    }
    else {
      (this->type_id_to_number_type_info)._M_h._M_buckets = pp_Var4;
    }
    uVar5 = (param_1->type_id_to_number_type_info)._M_h._M_bucket_count;
    (this->type_id_to_number_type_info)._M_h._M_bucket_count = uVar5;
    p_Var6 = (param_1->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt;
    (this->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt = p_Var6;
    (this->type_id_to_number_type_info)._M_h._M_element_count =
         (param_1->type_id_to_number_type_info)._M_h._M_element_count;
    if (p_Var6 != (_Hash_node_base *)0x0) {
      (this->type_id_to_number_type_info)._M_h._M_buckets[(ulong)*(uint *)&p_Var6[1]._M_nxt % uVar5]
           = &(this->type_id_to_number_type_info)._M_h._M_before_begin;
    }
    (param_1->type_id_to_number_type_info)._M_h._M_rehash_policy._M_next_resize = 0;
    (param_1->type_id_to_number_type_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (param_1->type_id_to_number_type_info)._M_h._M_bucket_count = 1;
    (param_1->type_id_to_number_type_info)._M_h._M_buckets = pp_Var2;
    (param_1->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (param_1->type_id_to_number_type_info)._M_h._M_element_count = 0;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->import_id_to_ext_inst_type)._M_h,&param_1->import_id_to_ext_inst_type);
  std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::_M_move_assign
            (&this->operands,&param_1->operands);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->endian_converted_words,&param_1->endian_converted_words);
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::_M_move_assign
            (&this->expected_operands,&param_1->expected_operands);
  return this;
}

Assistant:

State(const uint32_t* words_arg, size_t num_words_arg,
          spv_diagnostic* diagnostic_arg)
        : words(words_arg),
          num_words(num_words_arg),
          diagnostic(diagnostic_arg),
          word_index(0),
          instruction_count(0),
          endian(),
          requires_endian_conversion(false) {
      // Temporary storage for parser state within a single instruction.
      // Most instructions require fewer than 25 words or operands.
      operands.reserve(25);
      endian_converted_words.reserve(25);
      expected_operands.reserve(25);
    }